

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::EndQuery
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IQuery *pQuery,int param_2)

{
  QUERY_TYPE QueryType_00;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  QueryBase<Diligent::EngineGLImplTraits> *this_00;
  COMMAND_QUEUE_TYPE Type;
  char (*in_stack_fffffffffffffee8) [8];
  COMMAND_QUEUE_TYPE local_f2;
  String local_e0;
  char *local_c0;
  undefined1 local_b8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  COMMAND_QUEUE_TYPE QueueType;
  QUERY_TYPE QueryType;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  IQuery *pQuery_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  if (pQuery == (IQuery *)0x0) {
    FormatString<char[50]>
              ((string *)local_40,(char (*) [50])"IDeviceContext::EndQuery: pQuery must not be null"
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x698);
    std::__cxx11::string::~string((string *)local_40);
  }
  iVar3 = (*(pQuery->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  QueryType_00 = *(QUERY_TYPE *)(CONCAT44(extraout_var,iVar3) + 8);
  local_f2 = COMMAND_QUEUE_TYPE_TRANSFER;
  if (QueryType_00 != QUERY_TYPE_DURATION && QueryType_00 != QUERY_TYPE_TIMESTAMP) {
    local_f2 = COMMAND_QUEUE_TYPE_GRAPHICS;
  }
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x69c);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    FormatString<char[97]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x69c);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,local_f2);
  if (CVar2 != local_f2) {
    local_c0 = GetQueryTypeString(QueryType_00);
    GetCommandQueueTypeString_abi_cxx11_(&local_e0,(Diligent *)(ulong)(this->m_Desc).QueueType,Type)
    ;
    FormatString<char[25],char_const*,char[22],std::__cxx11::string,char[8]>
              ((string *)local_b8,(Diligent *)"EndQuery for query type ",(char (*) [25])&local_c0,
               (char **)0xf4cb59,(char (*) [22])&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               in_stack_fffffffffffffee8);
    std::__cxx11::string::~string((string *)&local_e0);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x69c);
    std::__cxx11::string::~string((string *)local_b8);
  }
  this_00 = &ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery)->
             super_QueryBase<Diligent::EngineGLImplTraits>;
  QueryBase<Diligent::EngineGLImplTraits>::OnEndQuery(this_00,(DeviceContextImplType *)this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EndQuery(IQuery* pQuery, int)
{
    DEV_CHECK_ERR(pQuery != nullptr, "IDeviceContext::EndQuery: pQuery must not be null");

    const QUERY_TYPE         QueryType = pQuery->GetDesc().Type;
    const COMMAND_QUEUE_TYPE QueueType = QueryType == QUERY_TYPE_DURATION || QueryType == QUERY_TYPE_TIMESTAMP ? COMMAND_QUEUE_TYPE_TRANSFER : COMMAND_QUEUE_TYPE_GRAPHICS;
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(QueueType, "EndQuery for query type ", GetQueryTypeString(QueryType));

    ClassPtrCast<QueryImplType>(pQuery)->OnEndQuery(static_cast<DeviceContextImplType*>(this));
}